

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::BVHNIntersector1<8,_16781328,_false,_embree::avx512::VirtualCurveIntersector1>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  float fVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  AABBNodeMB4D *node1;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong unaff_R15;
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar39;
  int iVar40;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  int iVar42;
  int iVar43;
  int iVar44;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  int iVar41;
  int iVar45;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined4 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  vfloat4 a0;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  float local_2578 [4];
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [32];
  undefined1 local_2518 [32];
  float local_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float fStack_24e0;
  float fStack_24dc;
  undefined4 local_24d8;
  undefined4 uStack_24d4;
  undefined4 uStack_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  undefined4 uStack_24c0;
  undefined4 uStack_24bc;
  undefined4 local_24b8;
  undefined4 uStack_24b4;
  undefined4 uStack_24b0;
  undefined4 uStack_24ac;
  undefined4 uStack_24a8;
  undefined4 uStack_24a4;
  undefined4 uStack_24a0;
  undefined4 uStack_249c;
  undefined4 local_2498;
  undefined4 uStack_2494;
  undefined4 uStack_2490;
  undefined4 uStack_248c;
  undefined4 uStack_2488;
  undefined4 uStack_2484;
  undefined4 uStack_2480;
  undefined4 uStack_247c;
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370;
  ulong local_2368 [1127];
  undefined1 auVar23 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar51 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar10 = ZEXT812(0) << 0x20;
    auVar47 = ZEXT816(0) << 0x40;
    auVar23._4_12_ = auVar10;
    auVar23._0_4_ = auVar51._0_4_;
    auVar21 = vrsqrt14ss_avx512f(auVar47,auVar23);
    fVar55 = auVar21._0_4_;
    local_2578[0] = fVar55 * 1.5 - auVar51._0_4_ * 0.5 * fVar55 * fVar55 * fVar55;
    local_24f8 = aVar2.x;
    auVar53._0_4_ = local_24f8 * local_2578[0];
    auVar53._4_4_ = aVar2.y * local_2578[0];
    auVar53._8_4_ = aVar2.z * local_2578[0];
    auVar53._12_4_ = aVar2.field_3.w * local_2578[0];
    auVar21 = vshufpd_avx(auVar53,auVar53,1);
    auVar51 = vmovshdup_avx(auVar53);
    auVar60._8_4_ = 0x80000000;
    auVar60._0_8_ = 0x8000000080000000;
    auVar60._12_4_ = 0x80000000;
    auVar58._0_4_ = auVar51._0_4_ ^ 0x80000000;
    auVar51 = vunpckhps_avx(auVar53,auVar47);
    auVar58._4_12_ = auVar10;
    auVar23 = vshufps_avx(auVar51,auVar58,0x41);
    auVar56._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
    auVar56._8_8_ = auVar60._8_8_ ^ auVar21._8_8_;
    auVar22 = vinsertps_avx(auVar56,auVar53,0x2a);
    auVar51 = vdpps_avx(auVar23,auVar23,0x7f);
    auVar21 = vdpps_avx(auVar22,auVar22,0x7f);
    uVar5 = vcmpps_avx512vl(auVar21,auVar51,1);
    auVar51 = vpmovm2d_avx512vl(uVar5);
    auVar61._0_4_ = auVar51._0_4_;
    auVar61._4_4_ = auVar61._0_4_;
    auVar61._8_4_ = auVar61._0_4_;
    auVar61._12_4_ = auVar61._0_4_;
    uVar18 = vpmovd2m_avx512vl(auVar61);
    auVar51 = vpcmpeqd_avx(auVar61,auVar61);
    auVar21._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar51._4_4_;
    auVar21._0_4_ = (uint)((byte)uVar18 & 1) * auVar51._0_4_;
    auVar21._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar51._8_4_;
    auVar21._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar51._12_4_;
    auVar51 = vblendvps_avx(auVar22,auVar23,auVar21);
    auVar21 = vdpps_avx(auVar51,auVar51,0x7f);
    auVar62._4_12_ = auVar10;
    auVar62._0_4_ = auVar21._0_4_;
    auVar22 = vrsqrt14ss_avx512f(auVar47,auVar62);
    fVar55 = auVar22._0_4_;
    auVar65 = ZEXT464((uint)(fVar55 * fVar55));
    fVar55 = fVar55 * 1.5 - auVar21._0_4_ * 0.5 * fVar55 * fVar55 * fVar55;
    auVar57._0_4_ = fVar55 * auVar51._0_4_;
    auVar57._4_4_ = fVar55 * auVar51._4_4_;
    auVar57._8_4_ = fVar55 * auVar51._8_4_;
    auVar57._12_4_ = fVar55 * auVar51._12_4_;
    auVar51 = vshufps_avx(auVar57,auVar57,0xc9);
    auVar21 = vshufps_avx(auVar53,auVar53,0xc9);
    auVar63._0_4_ = auVar21._0_4_ * auVar57._0_4_;
    auVar63._4_4_ = auVar21._4_4_ * auVar57._4_4_;
    auVar63._8_4_ = auVar21._8_4_ * auVar57._8_4_;
    auVar63._12_4_ = auVar21._12_4_ * auVar57._12_4_;
    auVar51 = vfmsub231ps_fma(auVar63,auVar53,auVar51);
    auVar21 = vshufps_avx(auVar51,auVar51,0xc9);
    auVar51 = vdpps_avx(auVar21,auVar21,0x7f);
    auVar22._4_12_ = auVar10;
    auVar22._0_4_ = auVar51._0_4_;
    auVar22 = vrsqrt14ss_avx512f(auVar47,auVar22);
    fVar55 = auVar22._0_4_;
    fVar55 = fVar55 * 1.5 - auVar51._0_4_ * 0.5 * fVar55 * fVar55 * fVar55;
    auVar50._0_4_ = auVar21._0_4_ * fVar55;
    auVar50._4_4_ = auVar21._4_4_ * fVar55;
    auVar50._8_4_ = auVar21._8_4_ * fVar55;
    auVar50._12_4_ = auVar21._12_4_ * fVar55;
    auVar51._0_4_ = local_2578[0] * auVar53._0_4_;
    auVar51._4_4_ = local_2578[0] * auVar53._4_4_;
    auVar51._8_4_ = local_2578[0] * auVar53._8_4_;
    auVar51._12_4_ = local_2578[0] * auVar53._12_4_;
    auVar22 = vunpcklps_avx(auVar57,auVar51);
    auVar51 = vunpckhps_avx(auVar57,auVar51);
    auVar23 = vunpcklps_avx(auVar50,auVar47);
    auVar21 = vunpckhps_avx(auVar50,auVar47);
    local_2548 = vunpcklps_avx(auVar51,auVar21);
    local_2568 = vunpcklps_avx(auVar22,auVar23);
    local_2558 = vunpckhps_avx(auVar22,auVar23);
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370 = 0;
    if (local_2378 != 8) {
      auVar51 = vmaxss_avx(ZEXT816(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar21 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar47._8_4_ = 0x7fffffff;
      auVar47._0_8_ = 0x7fffffff7fffffff;
      auVar47._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl((undefined1  [16])aVar2,auVar47);
      auVar54._8_4_ = 0x219392ef;
      auVar54._0_8_ = 0x219392ef219392ef;
      auVar54._12_4_ = 0x219392ef;
      uVar18 = vcmpps_avx512vl(auVar22,auVar54,1);
      auVar23 = vblendmps_avx512vl((undefined1  [16])aVar2,auVar54);
      bVar3 = (bool)((byte)uVar18 & 1);
      auVar24._0_4_ = (uint)bVar3 * auVar23._0_4_ | (uint)!bVar3 * auVar22._0_4_;
      bVar3 = (bool)((byte)(uVar18 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar3 * auVar23._4_4_ | (uint)!bVar3 * auVar22._4_4_;
      bVar3 = (bool)((byte)(uVar18 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar3 * auVar23._8_4_ | (uint)!bVar3 * auVar22._8_4_;
      bVar3 = (bool)((byte)(uVar18 >> 3) & 1);
      auVar24._12_4_ = (uint)bVar3 * auVar23._12_4_ | (uint)!bVar3 * auVar22._12_4_;
      auVar22 = vrcp14ps_avx512vl(auVar24);
      auVar9._8_4_ = 0x3f800000;
      auVar9._0_8_ = &DAT_3f8000003f800000;
      auVar9._12_4_ = 0x3f800000;
      auVar23 = vfnmadd213ps_avx512vl(auVar24,auVar22,auVar9);
      puVar14 = local_2368;
      auVar47 = vfmadd132ps_fma(auVar23,auVar22,auVar22);
      local_2498 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_24b8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_24d8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      auVar25._8_4_ = 1;
      auVar25._0_8_ = 0x100000001;
      auVar25._12_4_ = 1;
      auVar25._16_4_ = 1;
      auVar25._20_4_ = 1;
      auVar25._24_4_ = 1;
      auVar25._28_4_ = 1;
      local_2518 = vpermps_avx2(auVar25,ZEXT1632((undefined1  [16])aVar2));
      auVar27._8_4_ = 2;
      auVar27._0_8_ = 0x200000002;
      auVar27._12_4_ = 2;
      auVar27._16_4_ = 2;
      auVar27._20_4_ = 2;
      auVar27._24_4_ = 2;
      auVar27._28_4_ = 2;
      local_2538 = vpermps_avx2(auVar27,ZEXT1632((undefined1  [16])aVar2));
      local_23b8 = vbroadcastss_avx512vl(auVar47);
      auVar70 = ZEXT3264(local_23b8);
      auVar22 = vmovshdup_avx(auVar47);
      local_23d8 = vbroadcastsd_avx512vl(auVar22);
      auVar71 = ZEXT3264(local_23d8);
      auVar23 = vshufpd_avx(auVar47,auVar47,1);
      fVar55 = auVar47._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      local_23f8 = vpermps_avx512vl(auVar27,ZEXT1632(auVar47));
      auVar72 = ZEXT3264(local_23f8);
      auVar28._4_4_ = fVar55;
      auVar28._0_4_ = fVar55;
      auVar28._8_4_ = fVar55;
      auVar28._12_4_ = fVar55;
      auVar28._16_4_ = fVar55;
      auVar28._20_4_ = fVar55;
      auVar28._24_4_ = fVar55;
      auVar28._28_4_ = fVar55;
      auVar26 = ZEXT1632(CONCAT412(auVar47._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar47._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar47._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar55))));
      auVar25 = vpermps_avx2(auVar25,auVar26);
      auVar59 = ZEXT3264(auVar25);
      auVar27 = vpermps_avx2(auVar27,auVar26);
      uVar18 = (ulong)(auVar47._0_4_ < 0.0) * 0x20;
      uVar15 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x40;
      uVar16 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x80;
      local_2418 = vbroadcastss_avx512vl(auVar51);
      auVar73 = ZEXT3264(local_2418);
      uVar49 = auVar21._0_4_;
      auVar46 = ZEXT3264(CONCAT428(uVar49,CONCAT424(uVar49,CONCAT420(uVar49,CONCAT416(uVar49,
                                                  CONCAT412(uVar49,CONCAT48(uVar49,CONCAT44(uVar49,
                                                  uVar49))))))));
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26._16_4_ = 0x80000000;
      auVar26._20_4_ = 0x80000000;
      auVar26._24_4_ = 0x80000000;
      auVar26._28_4_ = 0x80000000;
      local_2438 = vxorps_avx512vl(auVar28,auVar26);
      auVar74 = ZEXT3264(local_2438);
      local_2458 = vxorps_avx512vl(auVar25,auVar26);
      auVar75 = ZEXT3264(local_2458);
      local_2478 = vxorps_avx512vl(auVar27,auVar26);
      auVar76 = ZEXT3264(local_2478);
      auVar25 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar77 = ZEXT3264(auVar25);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar78 = ZEXT3264(auVar25);
      fStack_24f4 = local_24f8;
      fStack_24f0 = local_24f8;
      fStack_24ec = local_24f8;
      fStack_24e8 = local_24f8;
      fStack_24e4 = local_24f8;
      fStack_24e0 = local_24f8;
      fStack_24dc = local_24f8;
      uStack_24d4 = local_24d8;
      uStack_24d0 = local_24d8;
      uStack_24cc = local_24d8;
      uStack_24c8 = local_24d8;
      uStack_24c4 = local_24d8;
      uStack_24c0 = local_24d8;
      uStack_24bc = local_24d8;
      uStack_24b4 = local_24b8;
      uStack_24b0 = local_24b8;
      uStack_24ac = local_24b8;
      uStack_24a8 = local_24b8;
      uStack_24a4 = local_24b8;
      uStack_24a0 = local_24b8;
      uStack_249c = local_24b8;
      uStack_2494 = local_2498;
      uStack_2490 = local_2498;
      uStack_248c = local_2498;
      uStack_2488 = local_2498;
      uStack_2484 = local_2498;
      uStack_2480 = local_2498;
      uStack_247c = local_2498;
      do {
        do {
          if (puVar14 == &local_2378) {
            return;
          }
          pfVar1 = (float *)(puVar14 + -1);
          puVar14 = puVar14 + -2;
        } while ((ray->super_RayK<1>).tfar < *pfVar1);
        uVar19 = *puVar14;
        do {
          if ((uVar19 & 8) == 0) {
            fVar55 = (ray->super_RayK<1>).dir.field_0.m128[3];
            uVar13 = (uint)uVar19 & 7;
            uVar11 = uVar19 & 0xfffffffffffffff0;
            if (uVar13 == 3) {
              auVar66._4_4_ = fVar55;
              auVar66._0_4_ = fVar55;
              auVar66._8_4_ = fVar55;
              auVar66._12_4_ = fVar55;
              auVar66._16_4_ = fVar55;
              auVar66._20_4_ = fVar55;
              auVar66._24_4_ = fVar55;
              auVar66._28_4_ = fVar55;
              fVar4 = 1.0 - fVar55;
              auVar35._0_4_ = fVar55 * *(float *)(uVar11 + 0x1c0);
              auVar35._4_4_ = fVar55 * *(float *)(uVar11 + 0x1c4);
              auVar35._8_4_ = fVar55 * *(float *)(uVar11 + 0x1c8);
              auVar35._12_4_ = fVar55 * *(float *)(uVar11 + 0x1cc);
              auVar35._16_4_ = fVar55 * *(float *)(uVar11 + 0x1d0);
              auVar35._20_4_ = fVar55 * *(float *)(uVar11 + 0x1d4);
              auVar35._24_4_ = fVar55 * *(float *)(uVar11 + 0x1d8);
              auVar35._28_4_ = 0;
              auVar64._0_4_ = fVar55 * *(float *)(uVar11 + 0x1e0);
              auVar64._4_4_ = fVar55 * *(float *)(uVar11 + 0x1e4);
              auVar64._8_4_ = fVar55 * *(float *)(uVar11 + 0x1e8);
              auVar64._12_4_ = fVar55 * *(float *)(uVar11 + 0x1ec);
              auVar64._16_4_ = fVar55 * *(float *)(uVar11 + 0x1f0);
              auVar64._20_4_ = fVar55 * *(float *)(uVar11 + 500);
              auVar64._24_4_ = fVar55 * *(float *)(uVar11 + 0x1f8);
              auVar64._28_4_ = 0;
              auVar59._0_4_ = fVar55 * *(float *)(uVar11 + 0x200);
              auVar59._4_4_ = fVar55 * *(float *)(uVar11 + 0x204);
              auVar59._8_4_ = fVar55 * *(float *)(uVar11 + 0x208);
              auVar59._12_4_ = fVar55 * *(float *)(uVar11 + 0x20c);
              auVar59._16_4_ = fVar55 * *(float *)(uVar11 + 0x210);
              auVar59._20_4_ = fVar55 * *(float *)(uVar11 + 0x214);
              auVar59._28_36_ = auVar65._28_36_;
              auVar59._24_4_ = fVar55 * *(float *)(uVar11 + 0x218);
              auVar69._4_4_ = fVar4;
              auVar69._0_4_ = fVar4;
              auVar69._8_4_ = fVar4;
              auVar69._12_4_ = fVar4;
              auVar69._16_4_ = fVar4;
              auVar69._20_4_ = fVar4;
              auVar69._24_4_ = fVar4;
              auVar69._28_4_ = fVar4;
              auVar68._0_12_ = ZEXT812(0);
              auVar68._12_4_ = 0;
              auVar51 = vfmadd231ps_fma(auVar35,auVar69,ZEXT1632(auVar68));
              auVar21 = vfmadd231ps_fma(auVar64,auVar69,ZEXT1632(auVar68));
              auVar22 = vfmadd231ps_fma(auVar59._0_32_,auVar69,ZEXT1632(auVar68));
              auVar65 = ZEXT1664(auVar22);
              auVar25 = vmulps_avx512vl(auVar66,*(undefined1 (*) [32])(uVar11 + 0x240));
              auVar27 = vmulps_avx512vl(auVar66,*(undefined1 (*) [32])(uVar11 + 0x260));
              auVar67._0_4_ = fVar4 + fVar55 * *(float *)(uVar11 + 0x220);
              auVar67._4_4_ = fVar4 + fVar55 * *(float *)(uVar11 + 0x224);
              auVar67._8_4_ = fVar4 + fVar55 * *(float *)(uVar11 + 0x228);
              auVar67._12_4_ = fVar4 + fVar55 * *(float *)(uVar11 + 0x22c);
              auVar67._16_4_ = fVar4 + fVar55 * *(float *)(uVar11 + 0x230);
              auVar67._20_4_ = fVar4 + fVar55 * *(float *)(uVar11 + 0x234);
              auVar67._24_4_ = fVar4 + fVar55 * *(float *)(uVar11 + 0x238);
              auVar67._28_4_ = fVar4 + 0.0;
              auVar28 = vaddps_avx512vl(auVar69,auVar25);
              auVar35 = vaddps_avx512vl(auVar69,auVar27);
              auVar25 = vmulps_avx512vl(local_2538,*(undefined1 (*) [32])(uVar11 + 0x100));
              auVar27 = vmulps_avx512vl(local_2538,*(undefined1 (*) [32])(uVar11 + 0x120));
              auVar26 = vmulps_avx512vl(local_2538,*(undefined1 (*) [32])(uVar11 + 0x140));
              auVar25 = vfmadd231ps_avx512vl
                                  (auVar25,local_2518,*(undefined1 (*) [32])(uVar11 + 0xa0));
              auVar27 = vfmadd231ps_avx512vl
                                  (auVar27,local_2518,*(undefined1 (*) [32])(uVar11 + 0xc0));
              auVar26 = vfmadd231ps_avx512vl
                                  (auVar26,local_2518,*(undefined1 (*) [32])(uVar11 + 0xe0));
              auVar29._4_4_ = fStack_24f4;
              auVar29._0_4_ = local_24f8;
              auVar29._8_4_ = fStack_24f0;
              auVar29._12_4_ = fStack_24ec;
              auVar29._16_4_ = fStack_24e8;
              auVar29._20_4_ = fStack_24e4;
              auVar29._24_4_ = fStack_24e0;
              auVar29._28_4_ = fStack_24dc;
              auVar25 = vfmadd231ps_avx512vl(auVar25,auVar29,*(undefined1 (*) [32])(uVar11 + 0x40));
              auVar27 = vfmadd231ps_avx512vl(auVar27,auVar29,*(undefined1 (*) [32])(uVar11 + 0x60));
              auVar26 = vfmadd231ps_avx512vl(auVar26,auVar29,*(undefined1 (*) [32])(uVar11 + 0x80));
              auVar29 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(auVar25,auVar29);
              auVar37 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              uVar6 = vcmpps_avx512vl(auVar29,auVar37,1);
              bVar3 = (bool)((byte)uVar6 & 1);
              iVar20 = auVar37._0_4_;
              auVar32._0_4_ = (uint)bVar3 * iVar20 | (uint)!bVar3 * auVar25._0_4_;
              bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
              iVar39 = auVar37._4_4_;
              auVar32._4_4_ = (uint)bVar3 * iVar39 | (uint)!bVar3 * auVar25._4_4_;
              bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
              iVar40 = auVar37._8_4_;
              auVar32._8_4_ = (uint)bVar3 * iVar40 | (uint)!bVar3 * auVar25._8_4_;
              bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
              iVar41 = auVar37._12_4_;
              auVar32._12_4_ = (uint)bVar3 * iVar41 | (uint)!bVar3 * auVar25._12_4_;
              bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
              iVar42 = auVar37._16_4_;
              auVar32._16_4_ = (uint)bVar3 * iVar42 | (uint)!bVar3 * auVar25._16_4_;
              bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
              iVar43 = auVar37._20_4_;
              auVar32._20_4_ = (uint)bVar3 * iVar43 | (uint)!bVar3 * auVar25._20_4_;
              bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
              iVar44 = auVar37._24_4_;
              iVar45 = auVar37._28_4_;
              auVar32._24_4_ = (uint)bVar3 * iVar44 | (uint)!bVar3 * auVar25._24_4_;
              bVar3 = SUB81(uVar6 >> 7,0);
              auVar32._28_4_ = (uint)bVar3 * iVar45 | (uint)!bVar3 * auVar25._28_4_;
              vandps_avx512vl(auVar27,auVar29);
              uVar6 = vcmpps_avx512vl(auVar32,auVar37,1);
              bVar3 = (bool)((byte)uVar6 & 1);
              auVar33._0_4_ = (uint)bVar3 * iVar20 | (uint)!bVar3 * auVar27._0_4_;
              bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
              auVar33._4_4_ = (uint)bVar3 * iVar39 | (uint)!bVar3 * auVar27._4_4_;
              bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
              auVar33._8_4_ = (uint)bVar3 * iVar40 | (uint)!bVar3 * auVar27._8_4_;
              bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
              auVar33._12_4_ = (uint)bVar3 * iVar41 | (uint)!bVar3 * auVar27._12_4_;
              bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
              auVar33._16_4_ = (uint)bVar3 * iVar42 | (uint)!bVar3 * auVar27._16_4_;
              bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
              auVar33._20_4_ = (uint)bVar3 * iVar43 | (uint)!bVar3 * auVar27._20_4_;
              bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
              auVar33._24_4_ = (uint)bVar3 * iVar44 | (uint)!bVar3 * auVar27._24_4_;
              bVar3 = SUB81(uVar6 >> 7,0);
              auVar33._28_4_ = (uint)bVar3 * iVar45 | (uint)!bVar3 * auVar27._28_4_;
              vandps_avx512vl(auVar26,auVar29);
              uVar6 = vcmpps_avx512vl(auVar33,auVar37,1);
              bVar3 = (bool)((byte)uVar6 & 1);
              auVar31._0_4_ = (uint)bVar3 * iVar20 | (uint)!bVar3 * auVar26._0_4_;
              bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
              auVar31._4_4_ = (uint)bVar3 * iVar39 | (uint)!bVar3 * auVar26._4_4_;
              bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
              auVar31._8_4_ = (uint)bVar3 * iVar40 | (uint)!bVar3 * auVar26._8_4_;
              bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
              auVar31._12_4_ = (uint)bVar3 * iVar41 | (uint)!bVar3 * auVar26._12_4_;
              bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
              auVar31._16_4_ = (uint)bVar3 * iVar42 | (uint)!bVar3 * auVar26._16_4_;
              bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
              auVar31._20_4_ = (uint)bVar3 * iVar43 | (uint)!bVar3 * auVar26._20_4_;
              bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
              auVar31._24_4_ = (uint)bVar3 * iVar44 | (uint)!bVar3 * auVar26._24_4_;
              bVar3 = SUB81(uVar6 >> 7,0);
              auVar31._28_4_ = (uint)bVar3 * iVar45 | (uint)!bVar3 * auVar26._28_4_;
              auVar25 = vrcp14ps_avx512vl(auVar32);
              auVar27 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar26 = vfnmadd213ps_avx512vl(auVar32,auVar25,auVar27);
              auVar29 = vfmadd132ps_avx512vl(auVar26,auVar25,auVar25);
              auVar25 = vrcp14ps_avx512vl(auVar33);
              auVar26 = vfnmadd213ps_avx512vl(auVar33,auVar25,auVar27);
              auVar32 = vfmadd132ps_avx512vl(auVar26,auVar25,auVar25);
              auVar25 = vrcp14ps_avx512vl(auVar31);
              auVar27 = vfnmadd213ps_avx512vl(auVar31,auVar25,auVar27);
              auVar33 = vfmadd132ps_avx512vl(auVar27,auVar25,auVar25);
              auVar37._4_4_ = uStack_24d4;
              auVar37._0_4_ = local_24d8;
              auVar37._8_4_ = uStack_24d0;
              auVar37._12_4_ = uStack_24cc;
              auVar37._16_4_ = uStack_24c8;
              auVar37._20_4_ = uStack_24c4;
              auVar37._24_4_ = uStack_24c0;
              auVar37._28_4_ = uStack_24bc;
              auVar25 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar11 + 0x100),auVar37,
                                   *(undefined1 (*) [32])(uVar11 + 0x160));
              auVar27 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar11 + 0x120),auVar37,
                                   *(undefined1 (*) [32])(uVar11 + 0x180));
              auVar26 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar11 + 0x140),auVar37,
                                   *(undefined1 (*) [32])(uVar11 + 0x1a0));
              auVar34._4_4_ = uStack_24b4;
              auVar34._0_4_ = local_24b8;
              auVar34._8_4_ = uStack_24b0;
              auVar34._12_4_ = uStack_24ac;
              auVar34._16_4_ = uStack_24a8;
              auVar34._20_4_ = uStack_24a4;
              auVar34._24_4_ = uStack_24a0;
              auVar34._28_4_ = uStack_249c;
              auVar25 = vfmadd231ps_avx512vl(auVar25,auVar34,*(undefined1 (*) [32])(uVar11 + 0xa0));
              auVar27 = vfmadd231ps_avx512vl(auVar27,auVar34,*(undefined1 (*) [32])(uVar11 + 0xc0));
              auVar26 = vfmadd231ps_avx512vl(auVar26,auVar34,*(undefined1 (*) [32])(uVar11 + 0xe0));
              auVar36._4_4_ = uStack_2494;
              auVar36._0_4_ = local_2498;
              auVar36._8_4_ = uStack_2490;
              auVar36._12_4_ = uStack_248c;
              auVar36._16_4_ = uStack_2488;
              auVar36._20_4_ = uStack_2484;
              auVar36._24_4_ = uStack_2480;
              auVar36._28_4_ = uStack_247c;
              auVar23 = vfmadd231ps_fma(auVar25,auVar36,*(undefined1 (*) [32])(uVar11 + 0x40));
              auVar47 = vfmadd231ps_fma(auVar27,auVar36,*(undefined1 (*) [32])(uVar11 + 0x60));
              auVar50 = vfmadd231ps_fma(auVar26,auVar36,*(undefined1 (*) [32])(uVar11 + 0x80));
              auVar25 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar23));
              auVar27 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar47));
              auVar26 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar50));
              auVar37 = vmulps_avx512vl(auVar25,auVar29);
              auVar34 = vmulps_avx512vl(auVar27,auVar32);
              auVar36 = vmulps_avx512vl(auVar26,auVar33);
              auVar25 = vsubps_avx(auVar67,ZEXT1632(auVar23));
              auVar27 = vsubps_avx(auVar28,ZEXT1632(auVar47));
              auVar26 = vsubps_avx(auVar35,ZEXT1632(auVar50));
              auVar28 = vmulps_avx512vl(auVar25,auVar29);
              auVar35 = vmulps_avx512vl(auVar27,auVar32);
              auVar32 = vmulps_avx512vl(auVar26,auVar33);
              auVar29 = vpminsd_avx2(auVar37,auVar28);
              auVar25 = vpminsd_avx2(auVar34,auVar35);
              auVar27 = vpminsd_avx2(auVar36,auVar32);
              auVar25 = vmaxps_avx(auVar25,auVar27);
              auVar26 = vpmaxsd_avx2(auVar37,auVar28);
              auVar27 = vpmaxsd_avx2(auVar34,auVar35);
              auVar28 = vpmaxsd_avx2(auVar36,auVar32);
              auVar27 = vminps_avx(auVar27,auVar28);
              auVar28 = vmaxps_avx512vl(auVar73._0_32_,auVar29);
              auVar25 = vmaxps_avx(auVar28,auVar25);
              auVar59 = ZEXT3264(auVar25);
              auVar26 = vminps_avx(auVar46._0_32_,auVar26);
              auVar27 = vminps_avx(auVar26,auVar27);
              uVar5 = vcmpps_avx512vl(auVar25,auVar27,2);
              bVar17 = (byte)uVar5;
            }
            else {
              auVar48._4_4_ = fVar55;
              auVar48._0_4_ = fVar55;
              auVar48._8_4_ = fVar55;
              auVar48._12_4_ = fVar55;
              auVar48._16_4_ = fVar55;
              auVar48._20_4_ = fVar55;
              auVar48._24_4_ = fVar55;
              auVar48._28_4_ = fVar55;
              auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar18),auVar48,
                                        *(undefined1 (*) [32])(uVar11 + 0x40 + uVar18));
              auVar26 = vfmadd213ps_avx512vl(ZEXT1632(auVar51),auVar70._0_32_,auVar74._0_32_);
              auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar15),auVar48,
                                        *(undefined1 (*) [32])(uVar11 + 0x40 + uVar15));
              auVar21 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar16),auVar48,
                                        *(undefined1 (*) [32])(uVar11 + 0x40 + uVar16));
              auVar25 = vfmadd213ps_avx512vl(ZEXT1632(auVar51),auVar71._0_32_,auVar75._0_32_);
              auVar27 = vfmadd213ps_avx512vl(ZEXT1632(auVar21),auVar72._0_32_,auVar76._0_32_);
              auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + (uVar18 ^ 0x20)),
                                        auVar48,*(undefined1 (*) [32])
                                                 (uVar11 + 0x40 + (uVar18 ^ 0x20)));
              auVar25 = vmaxps_avx(auVar25,auVar27);
              auVar28 = vfmadd213ps_avx512vl(ZEXT1632(auVar51),auVar70._0_32_,auVar74._0_32_);
              auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + (uVar15 ^ 0x20)),
                                        auVar48,*(undefined1 (*) [32])
                                                 (uVar11 + 0x40 + (uVar15 ^ 0x20)));
              auVar27 = vfmadd213ps_avx512vl(ZEXT1632(auVar51),auVar71._0_32_,auVar75._0_32_);
              auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + (uVar16 ^ 0x20)),
                                        auVar48,*(undefined1 (*) [32])
                                                 (uVar11 + 0x40 + (uVar16 ^ 0x20)));
              auVar29 = vfmadd213ps_avx512vl(ZEXT1632(auVar51),auVar72._0_32_,auVar76._0_32_);
              auVar27 = vminps_avx(auVar27,auVar29);
              auVar26 = vmaxps_avx512vl(auVar73._0_32_,auVar26);
              auVar25 = vmaxps_avx(auVar26,auVar25);
              auVar59 = ZEXT3264(auVar25);
              auVar26 = vminps_avx(auVar46._0_32_,auVar28);
              auVar27 = vminps_avx(auVar26,auVar27);
              if (uVar13 == 6) {
                uVar5 = vcmpps_avx512vl(auVar25,auVar27,2);
                uVar7 = vcmpps_avx512vl(auVar48,*(undefined1 (*) [32])(uVar11 + 0x1c0),0xd);
                uVar8 = vcmpps_avx512vl(auVar48,*(undefined1 (*) [32])(uVar11 + 0x1e0),1);
                bVar17 = (byte)uVar5 & (byte)uVar7 & (byte)uVar8;
              }
              else {
                uVar5 = vcmpps_avx512vl(auVar25,auVar27,2);
                bVar17 = (byte)uVar5;
              }
            }
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)bVar17);
          }
          if ((uVar19 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar20 = 4;
            }
            else {
              auVar25 = *(undefined1 (*) [32])(uVar19 & 0xfffffffffffffff0);
              auVar27 = ((undefined1 (*) [32])(uVar19 & 0xfffffffffffffff0))[1];
              auVar26 = vmovdqa64_avx512vl(auVar77._0_32_);
              auVar29 = auVar59._0_32_;
              auVar26 = vpternlogd_avx512vl(auVar26,auVar29,auVar78._0_32_,0xf8);
              uVar19 = unaff_R15 & 0xffffffff;
              auVar28 = vpcompressd_avx512vl(auVar26);
              bVar3 = (bool)((byte)uVar19 & 1);
              auVar30._0_4_ = (uint)bVar3 * auVar28._0_4_ | (uint)!bVar3 * auVar26._0_4_;
              bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
              auVar30._4_4_ = (uint)bVar3 * auVar28._4_4_ | (uint)!bVar3 * auVar26._4_4_;
              bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
              auVar30._8_4_ = (uint)bVar3 * auVar28._8_4_ | (uint)!bVar3 * auVar26._8_4_;
              bVar3 = (bool)((byte)(uVar19 >> 3) & 1);
              auVar30._12_4_ = (uint)bVar3 * auVar28._12_4_ | (uint)!bVar3 * auVar26._12_4_;
              bVar3 = (bool)((byte)(uVar19 >> 4) & 1);
              auVar30._16_4_ = (uint)bVar3 * auVar28._16_4_ | (uint)!bVar3 * auVar26._16_4_;
              bVar3 = (bool)((byte)(uVar19 >> 5) & 1);
              auVar30._20_4_ = (uint)bVar3 * auVar28._20_4_ | (uint)!bVar3 * auVar26._20_4_;
              bVar3 = (bool)((byte)(uVar19 >> 6) & 1);
              auVar30._24_4_ = (uint)bVar3 * auVar28._24_4_ | (uint)!bVar3 * auVar26._24_4_;
              bVar3 = (bool)((byte)(uVar19 >> 7) & 1);
              auVar30._28_4_ = (uint)bVar3 * auVar28._28_4_ | (uint)!bVar3 * auVar26._28_4_;
              auVar26 = vpermt2q_avx512vl(auVar25,auVar30,auVar27);
              uVar19 = auVar26._0_8_;
              iVar20 = 0;
              uVar11 = unaff_R15 - 1 & unaff_R15;
              if (uVar11 != 0) {
                auVar26 = vpshufd_avx2(auVar30,0x55);
                vpermt2q_avx512vl(auVar25,auVar26,auVar27);
                auVar28 = vpminsd_avx2(auVar30,auVar26);
                auVar26 = vpmaxsd_avx2(auVar30,auVar26);
                uVar11 = uVar11 - 1 & uVar11;
                if (uVar11 == 0) {
                  auVar28 = vpermi2q_avx512vl(auVar28,auVar25,auVar27);
                  uVar19 = auVar28._0_8_;
                  auVar25 = vpermt2q_avx512vl(auVar25,auVar26,auVar27);
                  *puVar14 = auVar25._0_8_;
                  auVar25 = vpermd_avx2(auVar26,auVar29);
                  *(int *)(puVar14 + 1) = auVar25._0_4_;
                  puVar14 = puVar14 + 2;
                }
                else {
                  auVar34 = vpshufd_avx2(auVar30,0xaa);
                  vpermt2q_avx512vl(auVar25,auVar34,auVar27);
                  auVar37 = vpminsd_avx2(auVar28,auVar34);
                  auVar28 = vpmaxsd_avx2(auVar28,auVar34);
                  auVar34 = vpminsd_avx2(auVar26,auVar28);
                  auVar26 = vpmaxsd_avx2(auVar26,auVar28);
                  uVar11 = uVar11 - 1 & uVar11;
                  if (uVar11 == 0) {
                    auVar28 = vpermi2q_avx512vl(auVar37,auVar25,auVar27);
                    uVar19 = auVar28._0_8_;
                    auVar28 = vpermt2q_avx512vl(auVar25,auVar26,auVar27);
                    *puVar14 = auVar28._0_8_;
                    auVar26 = vpermd_avx2(auVar26,auVar29);
                    *(int *)(puVar14 + 1) = auVar26._0_4_;
                    auVar25 = vpermt2q_avx512vl(auVar25,auVar34,auVar27);
                    puVar14[2] = auVar25._0_8_;
                    auVar25 = vpermd_avx2(auVar34,auVar29);
                    *(int *)(puVar14 + 3) = auVar25._0_4_;
                    puVar14 = puVar14 + 4;
                  }
                  else {
                    auVar65 = ZEXT3264(auVar29);
                    auVar28 = vpshufd_avx2(auVar30,0xff);
                    vpermt2q_avx512vl(auVar25,auVar28,auVar27);
                    auVar36 = vpminsd_avx2(auVar37,auVar28);
                    auVar28 = vpmaxsd_avx2(auVar37,auVar28);
                    auVar37 = vpminsd_avx2(auVar34,auVar28);
                    auVar28 = vpmaxsd_avx2(auVar34,auVar28);
                    auVar34 = vpminsd_avx2(auVar26,auVar28);
                    auVar26 = vpmaxsd_avx2(auVar26,auVar28);
                    uVar11 = uVar11 - 1 & uVar11;
                    iVar20 = 0;
                    if (uVar11 == 0) {
                      auVar28 = vpermi2q_avx512vl(auVar36,auVar25,auVar27);
                      uVar19 = auVar28._0_8_;
                      auVar28 = vpermt2q_avx512vl(auVar25,auVar26,auVar27);
                      *puVar14 = auVar28._0_8_;
                      auVar59 = ZEXT3264(auVar29);
                      auVar26 = vpermd_avx2(auVar26,auVar29);
                      *(int *)(puVar14 + 1) = auVar26._0_4_;
                      auVar26 = vpermt2q_avx512vl(auVar25,auVar34,auVar27);
                      puVar14[2] = auVar26._0_8_;
                      auVar26 = vpermd_avx2(auVar34,auVar29);
                      *(int *)(puVar14 + 3) = auVar26._0_4_;
                      auVar25 = vpermt2q_avx512vl(auVar25,auVar37,auVar27);
                      puVar14[4] = auVar25._0_8_;
                      auVar25 = vpermd_avx2(auVar37,auVar29);
                      *(int *)(puVar14 + 5) = auVar25._0_4_;
                      puVar14 = puVar14 + 6;
                    }
                    else {
                      auVar35 = valignd_avx512vl(auVar30,auVar30,3);
                      auVar28 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar36 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar28,auVar36);
                      auVar28 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar37 = vpermt2d_avx512vl(auVar36,auVar28,auVar37);
                      auVar37 = vpermt2d_avx512vl(auVar37,auVar28,auVar34);
                      auVar28 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar26 = vpermt2d_avx512vl(auVar37,auVar28,auVar26);
                      auVar59 = ZEXT3264(auVar26);
                      uVar19 = uVar11;
                      do {
                        auVar28 = auVar59._0_32_;
                        auVar52._8_4_ = 1;
                        auVar52._0_8_ = 0x100000001;
                        auVar52._12_4_ = 1;
                        auVar52._16_4_ = 1;
                        auVar52._20_4_ = 1;
                        auVar52._24_4_ = 1;
                        auVar52._28_4_ = 1;
                        auVar26 = vpermd_avx2(auVar52,auVar35);
                        auVar35 = valignd_avx512vl(auVar35,auVar35,1);
                        vpermt2q_avx512vl(auVar25,auVar35,auVar27);
                        uVar19 = uVar19 - 1 & uVar19;
                        uVar5 = vpcmpd_avx512vl(auVar26,auVar28,5);
                        auVar26 = vpmaxsd_avx2(auVar26,auVar28);
                        bVar17 = (byte)uVar5 << 1;
                        auVar28 = valignd_avx512vl(auVar28,auVar28,7);
                        bVar3 = (bool)((byte)uVar5 & 1);
                        auVar38._4_4_ = (uint)bVar3 * auVar28._4_4_ | (uint)!bVar3 * auVar26._4_4_;
                        auVar38._0_4_ = auVar26._0_4_;
                        bVar3 = (bool)(bVar17 >> 2 & 1);
                        auVar38._8_4_ = (uint)bVar3 * auVar28._8_4_ | (uint)!bVar3 * auVar26._8_4_;
                        bVar3 = (bool)(bVar17 >> 3 & 1);
                        auVar38._12_4_ =
                             (uint)bVar3 * auVar28._12_4_ | (uint)!bVar3 * auVar26._12_4_;
                        bVar3 = (bool)(bVar17 >> 4 & 1);
                        auVar38._16_4_ =
                             (uint)bVar3 * auVar28._16_4_ | (uint)!bVar3 * auVar26._16_4_;
                        bVar3 = (bool)(bVar17 >> 5 & 1);
                        auVar38._20_4_ =
                             (uint)bVar3 * auVar28._20_4_ | (uint)!bVar3 * auVar26._20_4_;
                        bVar3 = (bool)(bVar17 >> 6 & 1);
                        auVar38._24_4_ =
                             (uint)bVar3 * auVar28._24_4_ | (uint)!bVar3 * auVar26._24_4_;
                        auVar38._28_4_ =
                             (uint)(bVar17 >> 7) * auVar28._28_4_ |
                             (uint)!(bool)(bVar17 >> 7) * auVar26._28_4_;
                        auVar59 = ZEXT3264(auVar38);
                      } while (uVar19 != 0);
                      lVar12 = POPCOUNT(uVar11) + 3;
                      do {
                        auVar26 = vpermi2q_avx512vl(auVar38,auVar25,auVar27);
                        *puVar14 = auVar26._0_8_;
                        auVar28 = auVar59._0_32_;
                        auVar26 = vpermd_avx2(auVar28,auVar29);
                        *(int *)(puVar14 + 1) = auVar26._0_4_;
                        auVar38 = valignd_avx512vl(auVar28,auVar28,1);
                        puVar14 = puVar14 + 2;
                        auVar59 = ZEXT3264(auVar38);
                        lVar12 = lVar12 + -1;
                      } while (lVar12 != 0);
                      auVar25 = vpermt2q_avx512vl(auVar25,auVar38,auVar27);
                      uVar19 = auVar25._0_8_;
                      auVar59 = ZEXT3264(auVar29);
                    }
                  }
                }
              }
            }
          }
          else {
            iVar20 = 6;
          }
        } while (iVar20 == 0);
        if (iVar20 == 6) {
          local_2398 = auVar59._0_32_;
          auVar65 = ZEXT1664(auVar65._0_16_);
          (**(code **)((long)This->leafIntersector +
                      (ulong)*(byte *)(uVar19 & 0xfffffffffffffff0) * 0x40))(local_2578,ray,context)
          ;
          auVar59 = ZEXT3264(local_2398);
          auVar25 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
          auVar78 = ZEXT3264(auVar25);
          auVar25 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
          auVar77 = ZEXT3264(auVar25);
          auVar76 = ZEXT3264(local_2478);
          auVar75 = ZEXT3264(local_2458);
          auVar74 = ZEXT3264(local_2438);
          auVar73 = ZEXT3264(local_2418);
          auVar72 = ZEXT3264(local_23f8);
          auVar71 = ZEXT3264(local_23d8);
          auVar70 = ZEXT3264(local_23b8);
          fVar55 = (ray->super_RayK<1>).tfar;
          auVar46 = ZEXT3264(CONCAT428(fVar55,CONCAT424(fVar55,CONCAT420(fVar55,CONCAT416(fVar55,
                                                  CONCAT412(fVar55,CONCAT48(fVar55,CONCAT44(fVar55,
                                                  fVar55))))))));
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }